

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  int *in_RSI;
  int *in_RDI;
  int i;
  int local_14;
  
  *in_RDI = 0;
  for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
    if ((uint)(local_14 * *in_RSI) % 0xd == 1) {
      *in_RDI = local_14;
    }
  }
  if (*in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_low_impl.h"
            ,0x8c,"test condition failed: *r != 0");
    abort();
  }
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    int i;
    *r = 0;
    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++)
        if ((i * *x) % EXHAUSTIVE_TEST_ORDER == 1)
            *r = i;
    /* If this VERIFY_CHECK triggers we were given a noninvertible scalar (and thus
     * have a composite group order; fix it in exhaustive_tests.c). */
    VERIFY_CHECK(*r != 0);
}